

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 VmEvalChunk(jx9_vm *pVm,jx9_context *pCtx,SyString *pChunk,int iFlags,int bTrueReturn)

{
  jx9 *pjVar1;
  SySet *pSVar2;
  jx9_value *pObj;
  GenBlock *pGVar3;
  uint uVar4;
  GenBlock *pGVar5;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  GenBlock *pBlock;
  anon_union_8_3_18420de5_for_x local_a8;
  ulong uStack_a0;
  jx9_vm *pjStack_98;
  jx9_vm *local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  SySet local_60;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  local_60.nUsed = 0;
  local_60.nSize = 0;
  local_60.eSize = 0x18;
  local_60.nCursor = 0;
  local_60.pUserData = (void *)0x0;
  local_60.pAllocator = &pVm->sAllocator;
  local_60.pBase = SyMemBackendAlloc(&pVm->sAllocator,0x300);
  if (local_60.pBase != (void *)0x0) {
    local_60.nSize = 0x20;
  }
  if (iFlags == 0) {
    local_38 = 0;
    uStack_34 = 0;
    uStack_30 = 0;
    uStack_2c = 0;
  }
  else {
    pjVar1 = pVm->pEngine;
    local_38 = *(undefined4 *)&(pjVar1->xConf).xErr;
    uStack_34 = *(undefined4 *)((long)&(pjVar1->xConf).xErr + 4);
    uStack_30 = *(undefined4 *)&(pjVar1->xConf).pErrData;
    uStack_2c = *(undefined4 *)((long)&(pjVar1->xConf).pErrData + 4);
  }
  pBlock = (pVm->sCodeGen).pCurrent;
  pGVar3 = pBlock->pParent;
  uVar6 = extraout_RDX;
  while (pGVar5 = pGVar3, pGVar5 != (GenBlock *)0x0) {
    GenStateFreeBlock(pBlock);
    uVar6 = extraout_RDX_00;
    pBlock = pGVar5;
    pGVar3 = pGVar5->pParent;
  }
  (pVm->sCodeGen).xErr = (ProcConsumer)CONCAT44(uStack_34,local_38);
  (pVm->sCodeGen).pErrData = (void *)CONCAT44(uStack_2c,uStack_30);
  (pVm->sCodeGen).pCurrent = &(pVm->sCodeGen).sGlobal;
  (pVm->sCodeGen).pIn = (SyToken *)0x0;
  (pVm->sCodeGen).pEnd = (SyToken *)0x0;
  (pVm->sCodeGen).nErr = 0;
  pSVar2 = pVm->pByteContainer;
  pVm->pByteContainer = &local_60;
  uVar4 = jx9CompileScript(pVm,pChunk,(sxi32)uVar6);
  if ((pVm->sCodeGen).nErr == 0) {
    uVar4 = jx9VmEmitInstr(pVm,1,0,0,(void *)0x0,(sxu32 *)0x0);
    if (uVar4 == 0) {
      if (iFlags == 0) {
        uVar4 = 0x20;
      }
      else {
        uVar4 = 8;
      }
      local_70 = 0;
      uStack_78 = 0;
      local_80 = 0;
      uStack_88 = 0;
      local_a8.iVal._1_7_ = 0;
      local_a8.iVal._0_1_ = iFlags != 0;
      uStack_a0 = (ulong)uVar4;
      pjStack_98 = pVm;
      local_90 = pVm;
      VmLocalExec(pVm,&local_60,(jx9_value *)&local_a8);
      if (pCtx != (jx9_context *)0x0) {
        jx9MemObjStore((jx9_value *)&local_a8,pCtx->pRet);
      }
      uVar4 = jx9MemObjRelease((jx9_value *)&local_a8);
      goto LAB_00123dd8;
    }
  }
  if (pCtx != (jx9_context *)0x0) {
    pObj = pCtx->pRet;
    jx9MemObjRelease(pObj);
    (pObj->x).rVal = 0.0;
    uVar4 = pObj->iFlags & 0xfffffe90U | 8;
    pObj->iFlags = uVar4;
  }
LAB_00123dd8:
  pVm->pByteContainer = pSVar2;
  if (((jx9_vm *)local_60.pAllocator != (jx9_vm *)0x0) && (local_60.pBase != (void *)0x0)) {
    uVar4 = SyMemBackendFree(local_60.pAllocator,local_60.pBase);
  }
  return uVar4;
}

Assistant:

static sxi32 VmEvalChunk(
	jx9_vm *pVm,        /* Underlying Virtual Machine */
	jx9_context *pCtx,  /* Call Context */
	SyString *pChunk,   /* JX9 chunk to evaluate */ 
	int iFlags,         /* Compile flag */
	int bTrueReturn     /* TRUE to return execution result */
	)
{
	SySet *pByteCode, aByteCode;
	ProcConsumer xErr = 0;
	void *pErrData = 0;
	/* Initialize bytecode container */
	SySetInit(&aByteCode, &pVm->sAllocator, sizeof(VmInstr));
	SySetAlloc(&aByteCode, 0x20);
	/* Reset the code generator */
	if( bTrueReturn ){
		/* Included file, log compile-time errors */
		xErr = pVm->pEngine->xConf.xErr;
		pErrData = pVm->pEngine->xConf.pErrData;
	}
	jx9ResetCodeGenerator(pVm, xErr, pErrData);
	/* Swap bytecode container */
	pByteCode = pVm->pByteContainer;
	pVm->pByteContainer = &aByteCode;
	/* Compile the chunk */
	jx9CompileScript(pVm, pChunk, iFlags);
	if( pVm->sCodeGen.nErr > 0 ){
		/* Compilation error, return false */
		if( pCtx ){
			jx9_result_bool(pCtx, 0);
		}
	}else{
		jx9_value sResult; /* Return value */
		if( SXRET_OK != jx9VmEmitInstr(pVm, JX9_OP_DONE, 0, 0, 0, 0) ){
			/* Out of memory */
			if( pCtx ){
				jx9_result_bool(pCtx, 0);
			}
			goto Cleanup;
		}
		if( bTrueReturn ){
			/* Assume a boolean true return value */
			jx9MemObjInitFromBool(pVm, &sResult, 1);
		}else{
			/* Assume a null return value */
			jx9MemObjInit(pVm, &sResult);
		}
		/* Execute the compiled chunk */
		VmLocalExec(pVm, &aByteCode, &sResult);
		if( pCtx ){
			/* Set the execution result */
			jx9_result_value(pCtx, &sResult);
		}
		jx9MemObjRelease(&sResult);
	}
Cleanup:
	/* Cleanup the mess left behind */
	pVm->pByteContainer = pByteCode;
	SySetRelease(&aByteCode);
	return SXRET_OK;
}